

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int __thiscall
CVmConsole::log_event(CVmConsole *this,int evt,char *param,size_t paramlen,int param_is_utf8)

{
  char *tag;
  
  if (evt < 0x100) {
    switch(evt) {
    case 1:
      tag = "key";
      break;
    case 2:
      tag = "timeout";
      break;
    case 3:
      tag = "href";
      break;
    case 4:
      tag = "notimeout";
      break;
    case 5:
      tag = "eof";
      break;
    case 6:
      tag = "line";
      break;
    default:
      goto switchD_002411a1_default;
    }
  }
  else {
    if (evt < 0x2711) {
      if (evt == 0x100) {
        tag = "command";
        goto LAB_0024122f;
      }
      if (evt == 10000) {
        tag = "endqs";
        goto LAB_0024122f;
      }
    }
    else {
      if (evt == 0x2711) {
        tag = "dialog";
        goto LAB_0024122f;
      }
      if (evt == 0x2712) {
        tag = "file";
        goto LAB_0024122f;
      }
    }
switchD_002411a1_default:
    tag = "";
  }
LAB_0024122f:
  log_event(this,tag,param,paramlen,param_is_utf8);
  return evt;
}

Assistant:

int CVmConsole::log_event(VMG_ int evt,
                          const char *param, size_t paramlen,
                          int param_is_utf8)
{
    /* translate the event code to a tag, and log the event */
    log_event(vmg_ evt_to_tag(evt), param, paramlen, param_is_utf8);

    /* return the event type code */
    return evt;
}